

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::dot_sep(spec *s)

{
  sequence *in_RDI;
  char_type in_stack_ffffffffffffff8f;
  sequence *this;
  repeat_at_least *in_stack_ffffffffffffffa8;
  character *in_stack_ffffffffffffffb0;
  repeat_at_least *in_stack_ffffffffffffffb8;
  sequence *in_stack_ffffffffffffffc0;
  spec *in_stack_ffffffffffffffc8;
  
  this = in_RDI;
  ws(in_stack_ffffffffffffffc8);
  character::character((character *)this,in_stack_ffffffffffffff8f);
  ws(in_stack_ffffffffffffffc8);
  sequence::
  sequence<toml::detail::repeat_at_least,toml::detail::character,toml::detail::repeat_at_least>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  character::~character((character *)0x7228d9);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  return in_RDI;
}

Assistant:

TOML11_INLINE sequence dot_sep(const spec& s)
{
    return sequence(ws(s), character('.'), ws(s));
}